

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

Page * __thiscall
DListBase<Memory::CustomHeap::Page,RealCount>::
PrependNode<Memory::ArenaAllocator,char*,void*,Memory::CustomHeap::BucketId>
          (DListBase<Memory::CustomHeap::Page,RealCount> *this,ArenaAllocator *allocator,
          char *param1,void *param2,BucketId param3)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  DListNode<Memory::CustomHeap::Page> *this_00;
  DListNodeBase<Memory::CustomHeap::Page> **ppDVar1;
  TrackAllocData local_68;
  DListNode<Memory::CustomHeap::Page> *local_40;
  Node *newNode;
  void *pvStack_30;
  BucketId param3_local;
  void *param2_local;
  char *param1_local;
  ArenaAllocator *allocator_local;
  DListBase<Memory::CustomHeap::Page,_RealCount> *this_local;
  
  newNode._4_4_ = param3;
  pvStack_30 = param2;
  param2_local = param1;
  param1_local = (char *)allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&DListNode<Memory::CustomHeap::Page>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x131);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&allocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_68);
  this_00 = (DListNode<Memory::CustomHeap::Page> *)
            new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)alloc,0x3f67b0);
  DListNode<Memory::CustomHeap::Page>::DListNode<char*,void*,Memory::CustomHeap::BucketId>
            (this_00,(char *)param2_local,pvStack_30,newNode._4_4_);
  if (this_00 == (DListNode<Memory::CustomHeap::Page> *)0x0) {
    this_local = (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0;
  }
  else {
    local_40 = this_00;
    ppDVar1 = DListNodeBase<Memory::CustomHeap::Page>::Next
                        ((DListNodeBase<Memory::CustomHeap::Page> *)this);
    DListBase<Memory::CustomHeap::Page,_RealCount>::InsertNodeBefore
              (*ppDVar1,&local_40->super_DListNodeBase<Memory::CustomHeap::Page>);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::CustomHeap::Page,_RealCount> *)&local_40->data;
  }
  return (Page *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }